

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PairedReadsDatastore.cc
# Opt level: O2

string * __thiscall
PairedReadsDatastore::ls_abi_cxx11_
          (string *__return_storage_ptr__,PairedReadsDatastore *this,int level,bool recursive)

{
  ostream *poVar1;
  string spacer;
  string local_1d0;
  stringstream ss;
  ostream local_1a0;
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  spacer._M_dataplus._M_p = (pointer)&spacer.field_2;
  std::__cxx11::string::_M_construct((ulong)&spacer,(char)level * '\x02');
  poVar1 = std::operator<<(&local_1a0,(string *)&spacer);
  poVar1 = std::operator<<(poVar1,"Paired Reads Datastore ");
  poVar1 = std::operator<<(poVar1,(string *)&this->name);
  poVar1 = std::operator<<(poVar1,": ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1," reads");
  std::endl<char,std::char_traits<char>>(poVar1);
  if (recursive) {
    PairedReadsMapper::ls_abi_cxx11_(&local_1d0,&this->mapper,level + 1,true);
    std::operator<<(&local_1a0,(string *)&local_1d0);
    std::__cxx11::string::~string((string *)&local_1d0);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::~string((string *)&spacer);
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return __return_storage_ptr__;
}

Assistant:

std::string PairedReadsDatastore::ls(int level, bool recursive) const {
    std::stringstream ss;
    std::string spacer(2*level,' ');
    ss<<spacer<<"Paired Reads Datastore "<<name<<": "<<size()<<" reads"<<std::endl;
    if (recursive) ss<<mapper.ls(level+1,true);
    return ss.str();
}